

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

LayoutBindingTestResult * __thiscall
glcts::LayoutBindingBaseCase::binding_basic_render
          (LayoutBindingTestResult *__return_storage_ptr__,LayoutBindingBaseCase *this)

{
  char *pcVar1;
  bool bVar2;
  bool passed_00;
  int iVar3;
  GLint GVar4;
  ostream *poVar5;
  reference piVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LayoutBindingProgram *pLVar7;
  long *plVar8;
  code *local_4f0;
  String local_450;
  int *local_430;
  String local_428;
  undefined1 local_408 [8];
  LayoutBindingTestResult drawTestResult;
  String local_3d8;
  LayoutBindingProgramAutoPtr local_3b8;
  LayoutBindingProgramAutoPtr program;
  String local_390;
  allocator<char> local_369;
  string local_368 [32];
  string local_348 [32];
  String local_328;
  string local_308 [32];
  String local_2e8;
  allocator<char> local_2c1;
  String local_2c0;
  String local_2a0;
  allocator<char> local_279;
  String local_278;
  undefined1 local_258 [8];
  String decl;
  iterator iStack_230;
  int binding;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_228;
  iterator it;
  vector<int,_std::allocator<int>_> bindings;
  string local_1d8 [32];
  string local_1b8 [32];
  undefined1 local_198 [8];
  StringStream s;
  bool passed;
  LayoutBindingBaseCase *this_local;
  
  s.super_ostringstream._375_1_ = 1;
  StringStream::StringStream((StringStream *)local_198);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_1d8,this,0);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1b])
            (local_1b8,this,local_1d8);
  poVar5 = std::operator<<((ostream *)local_198,local_1b8);
  std::operator<<(poVar5,";\n");
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::ostringstream::str();
  setTemplateParam(this,"UNIFORM_ACCESS",
                   (String *)
                   &bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage);
  iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x20])();
  makeSparseRange((vector<int,_std::allocator<int>_> *)&it,this,iVar3,0);
  local_228._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)&it);
  while( true ) {
    iStack_230 = std::vector<int,_std::allocator<int>_>::end
                           ((vector<int,_std::allocator<int>_> *)&it);
    bVar2 = __gnu_cxx::operator<(&local_228,&stack0xfffffffffffffdd0);
    if (!bVar2) break;
    piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_228);
    decl.field_2._12_4_ = *piVar6;
    iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
    pcVar1 = *(char **)CONCAT44(extraout_var,iVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,pcVar1,&local_279);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1a])
              (&local_2a0,this,(ulong)(uint)decl.field_2._12_4_);
    iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
    pcVar1 = *(char **)(CONCAT44(extraout_var_00,iVar3) + 0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,pcVar1,&local_2c1);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_308,this,0);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
              (&local_2e8,this,local_308);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_348,this,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_368,"float",&local_369);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
              (&local_328,this,local_348,local_368);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_390,this,0);
    std::__cxx11::string::string((string *)&program);
    buildUniformDecl((String *)local_258,this,&local_278,&local_2a0,&local_2c0,&local_2e8,&local_328
                     ,&local_390,(String *)&program);
    std::__cxx11::string::~string((string *)&program);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string(local_368);
    std::allocator<char>::~allocator(&local_369);
    std::__cxx11::string::~string(local_348);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string(local_308);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::allocator<char>::~allocator(&local_2c1);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator(&local_279);
    setTemplateParam(this,"UNIFORM_DECL",(String *)local_258);
    updateTemplate(this);
    LayoutBindingProgram::LayoutBindingProgramAutoPtr::LayoutBindingProgramAutoPtr
              (&local_3b8,&this->super_IProgramContextSupplier);
    pLVar7 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_3b8);
    bVar2 = LayoutBindingProgram::compiledAndLinked(pLVar7);
    bVar2 = (s.super_ostringstream._375_1_ & 1 & bVar2) != 0;
    s.super_ostringstream._375_1_ = bVar2;
    if (bVar2) {
      local_4f0 = (code *)this->m_drawTest;
      plVar8 = (long *)((long)&(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode +
                       *(long *)&this->field_0x88);
      if (((ulong)local_4f0 & 1) != 0) {
        local_4f0 = *(code **)(local_4f0 + *plVar8 + -1);
      }
      pLVar7 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_3b8);
      GVar4 = LayoutBindingProgram::getProgram(pLVar7);
      (*local_4f0)(local_408,plVar8,GVar4);
      bVar2 = LayoutBindingTestResult::testPassed((LayoutBindingTestResult *)local_408);
      if (!bVar2) {
        passed_00 = LayoutBindingTestResult::testPassed((LayoutBindingTestResult *)local_408);
        LayoutBindingTestResult::getReason_abi_cxx11_
                  (&local_428,(LayoutBindingTestResult *)local_408);
        LayoutBindingTestResult::LayoutBindingTestResult
                  (__return_storage_ptr__,passed_00,&local_428,false);
        std::__cxx11::string::~string((string *)&local_428);
      }
      drawTestResult.m_reason.field_2._13_3_ = 0;
      drawTestResult.m_reason.field_2._M_local_buf[0xc] = !bVar2;
      LayoutBindingTestResult::~LayoutBindingTestResult((LayoutBindingTestResult *)local_408);
    }
    else {
      pLVar7 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_3b8);
      LayoutBindingProgram::getErrorLog_abi_cxx11_(&local_3d8,pLVar7,false);
      LayoutBindingTestResult::LayoutBindingTestResult
                (__return_storage_ptr__,bVar2,&local_3d8,false);
      std::__cxx11::string::~string((string *)&local_3d8);
      drawTestResult.m_reason.field_2._12_4_ = 1;
    }
    LayoutBindingProgram::LayoutBindingProgramAutoPtr::~LayoutBindingProgramAutoPtr(&local_3b8);
    std::__cxx11::string::~string((string *)local_258);
    if (drawTestResult.m_reason.field_2._12_4_ != 0) goto LAB_013a6838;
    local_430 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator++(&local_228,0);
  }
  std::__cxx11::string::string((string *)&local_450);
  LayoutBindingTestResult::LayoutBindingTestResult(__return_storage_ptr__,true,&local_450,false);
  std::__cxx11::string::~string((string *)&local_450);
  drawTestResult.m_reason.field_2._12_4_ = 1;
LAB_013a6838:
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&it);
  StringStream::~StringStream((StringStream *)local_198);
  return __return_storage_ptr__;
}

Assistant:

LayoutBindingTestResult LayoutBindingBaseCase::binding_basic_render()
{
	bool passed = true;

	StringStream s;
	s << buildAccess(getDefaultUniformName()) << ";\n";
	setTemplateParam("UNIFORM_ACCESS", s.str());

	std::vector<int> bindings = makeSparseRange(maxBindings());
	for (std::vector<int>::iterator it = bindings.begin(); it < bindings.end(); it++)
	{
		int	binding = *it;
		String decl =
			buildUniformDecl(String(getTestParameters().keyword), buildLayout(binding),
							 String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
							 buildBlock(getDefaultUniformName()), getDefaultUniformName(), String());
		setTemplateParam("UNIFORM_DECL", decl);
		updateTemplate();

		LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
		passed &= program->compiledAndLinked();
		if (!passed)
		{
			return LayoutBindingTestResult(passed, program->getErrorLog());
		}

		LayoutBindingTestResult drawTestResult = ((*this).*(m_drawTest))(program->getProgram(), binding);
		if (!drawTestResult.testPassed())
		{
			return LayoutBindingTestResult(drawTestResult.testPassed(), drawTestResult.getReason());
		}
	}
	return true;
}